

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool test3(void)

{
  bool bVar1;
  reference piVar2;
  ostream *poVar3;
  int *x;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> v;
  int local_30;
  int local_2c;
  undefined1 local_28 [4];
  int i;
  Queue q;
  
  CP::queue<int>::queue((queue<int> *)local_28);
  for (local_2c = 0; local_2c < 100; local_2c = local_2c + 1) {
    local_30 = 100 - local_2c;
    CP::queue<int>::push((queue<int> *)local_28,&local_30);
  }
  CP::queue<int>::to_vector
            ((vector<int,_std::allocator<int>_> *)&__range1,(queue<int> *)local_28,0x14);
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)&__range1);
  x = (int *)std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &x);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar2);
    std::operator<<(poVar3," ");
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__range1);
  CP::queue<int>::~queue((queue<int> *)local_28);
  return true;
}

Assistant:

bool test3() {
  Queue q;
  for (int i = 0;i < 100;i++)
    q.push(100-i);
  vector<int> v = q.to_vector(20);
  for (auto &x : v) {
    cout << x << " ";
  }
  cout << endl;
  return true;
}